

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::ServiceDescriptor>
          (DescriptorBuilder *this,Edition edition,Proto *proto,ServiceDescriptor *descriptor,
          OptionsType *options,FlatAllocator *alloc,ErrorLocation error_location,bool force_merge)

{
  byte *pbVar1;
  uint uVar2;
  ushort *puVar3;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FeatureSet *pFVar4;
  size_t sVar5;
  FeatureSet *pFVar6;
  undefined1 *from;
  Tables *unaff_RBX;
  Edition unaff_EBP;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 *this_00;
  OptionsType *unaff_R13;
  ServiceDescriptor *unaff_R14;
  DescriptorBuilder *unaff_R15;
  string_view element_name;
  string_view element_name_00;
  StatusOr<google::protobuf::FeatureSet> merged;
  FeatureSet base_features;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 *local_e0;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 local_d8;
  FeatureSet local_d0;
  FeatureSet local_80;
  
  pFVar6 = descriptor->file_->merged_features_;
  from = _FeatureSet_default_instance_;
  descriptor->proto_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  descriptor->merged_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  if ((this->feature_resolver_).
      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::FeatureResolver>._M_engaged == false) {
    this_00 = &local_d8;
    ResolveFeaturesImpl<google::protobuf::ServiceDescriptor>((DescriptorBuilder *)&this_00->status_)
    ;
    edition = unaff_EBP;
LAB_0024a1d3:
    this_00 = *(anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 **)
               ((ulong)this_00 & 0xfffffffffffffffe);
    options = unaff_R13;
    descriptor = unaff_R14;
    this = unaff_R15;
LAB_0024a07d:
    pFVar4 = (FeatureSet *)
             Arena::DefaultConstruct<google::protobuf::FeatureSet>((Arena *)&this_00->status_);
    (options->field_0)._impl_.features_ = pFVar4;
  }
  else {
    uVar2 = (options->field_0)._impl_._has_bits_.has_bits_[0];
    pFVar4 = (options->field_0)._impl_.features_;
    if ((pFVar4 == (FeatureSet *)0x0 & (byte)uVar2) == 1) {
      internal::protobuf_assumption_failed
                ("!value || _impl_.features_ != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                 ,0x4d07);
    }
    if ((uVar2 & 1) == 0) goto LAB_0024a0b1;
    unaff_RBX = this->tables_;
    if (pFVar4 == (FeatureSet *)0x0) {
      this_00 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 *)
                (options->super_Message).super_MessageLite._internal_metadata_.ptr_;
      unaff_R13 = options;
      unaff_R14 = descriptor;
      unaff_R15 = this;
      if (((ulong)this_00 & 1) != 0) goto LAB_0024a1d3;
      goto LAB_0024a07d;
    }
  }
  from = (undefined1 *)DescriptorPool::Tables::InternFeatureSet(unaff_RBX,pFVar4);
  descriptor->proto_features_ = (FeatureSet *)from;
  pFVar4 = (options->field_0)._impl_.features_;
  if (pFVar4 != (FeatureSet *)0x0) {
    FeatureSet::Clear(pFVar4);
    from = (undefined1 *)descriptor->proto_features_;
  }
  pbVar1 = (byte *)((long)&options->field_0 + 0x18);
  *pbVar1 = *pbVar1 & 0xfe;
LAB_0024a0b1:
  FeatureSet::FeatureSet(&local_80,(Arena *)0x0,(FeatureSet *)from);
  if (((int)edition < 1000) &&
     (descriptor->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_)) {
    puVar3 = (ushort *)(descriptor->all_names_).payload_;
    element_name._M_len = (ulong)*puVar3;
    element_name._M_str = (char *)((long)puVar3 + ~element_name._M_len);
    AddError(this,element_name,&proto->super_Message,error_location,
             "Features are only valid under editions.");
  }
  sVar5 = FeatureSet::ByteSizeLong(&local_80);
  if (sVar5 == 0 && !force_merge) {
    descriptor->merged_features_ = pFVar6;
  }
  else {
    FeatureResolver::MergeFeatures
              ((StatusOr<google::protobuf::FeatureSet> *)&local_d8.status_,
               (FeatureResolver *)&this->feature_resolver_,pFVar6,&local_80);
    if (local_d8 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1) {
      pFVar6 = DescriptorPool::Tables::InternFeatureSet(this->tables_,&local_d0);
      descriptor->merged_features_ = pFVar6;
    }
    else {
      puVar3 = (ushort *)(descriptor->all_names_).payload_;
      element_name_00._M_len = (ulong)*puVar3;
      element_name_00._M_str = (char *)((long)puVar3 + ~element_name_00._M_len);
      make_error.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::ServiceDescriptor>(google::protobuf::Edition,google::protobuf::ServiceDescriptor::Proto_const&,google::protobuf::ServiceDescriptor*,google::protobuf::ServiceDescriptor::OptionsType*,google::protobuf::internal::FlatAllocator&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,bool)::_lambda()_1_,std::__cxx11::string>
      ;
      make_error.ptr_.obj = &local_e0;
      local_e0 = &local_d8;
      AddError(this,element_name_00,&proto->super_Message,error_location,make_error);
    }
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::~StatusOrData
              ((StatusOrData<google::protobuf::FeatureSet> *)&local_d8.status_);
  }
  FeatureSet::~FeatureSet(&local_80);
  return;
}

Assistant:

void DescriptorBuilder::ResolveFeaturesImpl(
    Edition edition, const typename DescriptorT::Proto& proto,
    DescriptorT* descriptor, typename DescriptorT::OptionsType* options,
    internal::FlatAllocator& alloc,
    DescriptorPool::ErrorCollector::ErrorLocation error_location,
    bool force_merge) {
  const FeatureSet& parent_features = GetParentFeatures(descriptor);
  descriptor->proto_features_ = &FeatureSet::default_instance();
  descriptor->merged_features_ = &FeatureSet::default_instance();

  ABSL_CHECK(feature_resolver_.has_value());

  if (options->has_features()) {
    // Remove the features from the child's options proto to avoid leaking
    // internal details.
    descriptor->proto_features_ =
        tables_->InternFeatureSet(std::move(*options->mutable_features()));
    options->clear_features();
  }

  FeatureSet base_features = *descriptor->proto_features_;

  // Handle feature inference from proto2/proto3.
  if (IsLegacyEdition(edition)) {
    if (descriptor->proto_features_ != &FeatureSet::default_instance()) {
      AddError(descriptor->name(), proto, error_location,
               "Features are only valid under editions.");
    }
  }
  InferLegacyProtoFeatures(proto, *options, edition, base_features);

  if (base_features.ByteSizeLong() == 0 && !force_merge) {
    // Nothing to merge, and we aren't forcing it.
    descriptor->merged_features_ = &parent_features;
    return;
  }

  // Calculate the merged features for this target.
  absl::StatusOr<FeatureSet> merged =
      feature_resolver_->MergeFeatures(parent_features, base_features);
  if (!merged.ok()) {
    AddError(descriptor->name(), proto, error_location,
             [&] { return std::string(merged.status().message()); });
    return;
  }

  descriptor->merged_features_ = tables_->InternFeatureSet(*std::move(merged));
}